

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnrichableSpiAnalyzer.cpp
# Opt level: O2

void __thiscall EnrichableSpiAnalyzer::EnrichableSpiAnalyzer(EnrichableSpiAnalyzer *this)

{
  EnrichableSpiAnalyzerSettings *this_00;
  EnrichableAnalyzerSubprocess *this_01;
  
  Analyzer2::Analyzer2(&this->super_Analyzer2);
  *(undefined ***)this = &PTR__EnrichableSpiAnalyzer_00111c60;
  this_00 = (EnrichableSpiAnalyzerSettings *)operator_new(0xc0);
  EnrichableSpiAnalyzerSettings::EnrichableSpiAnalyzerSettings(this_00);
  (this->mSettings)._M_ptr = this_00;
  (this->mResults)._M_ptr = (EnrichableSpiAnalyzerResults *)0x0;
  this->mSimulationInitilized = false;
  this_01 = (EnrichableAnalyzerSubprocess *)operator_new(0x40);
  EnrichableAnalyzerSubprocess::EnrichableAnalyzerSubprocess(this_01);
  (this->mSubprocess)._M_ptr = this_01;
  EnrichableSpiSimulationDataGenerator::EnrichableSpiSimulationDataGenerator
            (&this->mSimulationDataGenerator);
  this->mClock = (AnalyzerChannelData *)0x0;
  this->mEnable = (AnalyzerChannelData *)0x0;
  this->mMosi = (AnalyzerChannelData *)0x0;
  this->mMiso = (AnalyzerChannelData *)0x0;
  (this->mArrowLocations).
  super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mArrowLocations).
  super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->mArrowLocations).
           super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
           super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->mArrowLocations).
           super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 1) = 0;
  Analyzer::SetAnalyzerSettings((AnalyzerSettings *)this);
  return;
}

Assistant:

EnrichableSpiAnalyzer::EnrichableSpiAnalyzer()
:	Analyzer2(),
	mSettings( new EnrichableSpiAnalyzerSettings() ),
	mSimulationInitilized( false ),
	mMosi( NULL ),
	mMiso( NULL ),
	mClock( NULL ),
	mEnable( NULL ),
	mSubprocess( new EnrichableAnalyzerSubprocess() )
{	
	SetAnalyzerSettings( mSettings.get() );
}